

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O0

void Abc_FrameCopyLTLDataBase(Abc_Frame_t *pAbc,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  char *__s;
  size_t sVar3;
  char *__s_00;
  int local_2c;
  int i;
  char *tempFormula;
  char *pLtlFormula;
  Abc_Ntk_t *pNtk_local;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc->vLTLProperties_global != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(pAbc->vLTLProperties_global);
    pAbc->vLTLProperties_global = (Vec_Ptr_t *)0x0;
  }
  iVar1 = Vec_PtrSize(pNtk->vLtlProperties);
  pVVar2 = Vec_PtrAlloc(iVar1);
  pAbc->vLTLProperties_global = pVVar2;
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vLtlProperties), local_2c < iVar1;
      local_2c = local_2c + 1) {
    __s = (char *)Vec_PtrEntry(pNtk->vLtlProperties,local_2c);
    sVar3 = strlen(__s);
    __s_00 = (char *)malloc(sVar3 + 1);
    sprintf(__s_00,"%s",__s);
    Vec_PtrPush(pAbc->vLTLProperties_global,__s_00);
  }
  return;
}

Assistant:

void Abc_FrameCopyLTLDataBase( Abc_Frame_t *pAbc, Abc_Ntk_t * pNtk )
{
    char *pLtlFormula, *tempFormula;
    int i;

    if( pAbc->vLTLProperties_global != NULL )
    {
//        printf("Deleting exisitng LTL database from the frame\n");
        Vec_PtrFree( pAbc->vLTLProperties_global );
        pAbc->vLTLProperties_global = NULL;
    }
    pAbc->vLTLProperties_global = Vec_PtrAlloc(Vec_PtrSize(pNtk->vLtlProperties));
    Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pLtlFormula, i )
    {
        tempFormula = (char *)malloc( sizeof(char)*(strlen(pLtlFormula)+1) );
        sprintf( tempFormula, "%s", pLtlFormula );
        Vec_PtrPush( pAbc->vLTLProperties_global, tempFormula );
    }
}